

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.h
# Opt level: O1

Maybe<unsigned_long> __thiscall
kj::
Table<kj::StringPtr,_kj::TreeIndex<kj::_::(anonymous_namespace)::StringCompare>,_kj::TreeIndex<kj::_::(anonymous_namespace)::StringLengthCompare>_>
::Impl<1UL,_false>::insert
          (Impl<1UL,_false> *this,
          Table<kj::StringPtr,_kj::HashIndex<kj::_::(anonymous_namespace)::StringHasher>_> *table,
          size_t pos,StringPtr *row,uint skip)

{
  MaybeUint MVar1;
  bool bVar2;
  void *pvVar3;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 aVar4;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 extraout_RDX;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 extraout_RDX_00;
  ulong uVar5;
  Maybe<unsigned_long> MVar6;
  bool success;
  undefined1 local_98 [16];
  Iterator local_88;
  StringPtr *local_70;
  long local_68;
  Deferred<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_table_h:450:5)>
  local_60;
  
  if (skip == 1) {
    *this = (Impl<1UL,_false>)0x0;
    goto LAB_00173fd2;
  }
  local_70 = (table->rows).builder.ptr;
  local_68 = (long)(table->rows).builder.pos - (long)local_70 >> 4;
  local_98._0_8_ = (row->content).size_ - 1;
  local_60.maybeFunc.ptr.field_1.value.table =
       (Table<kj::StringPtr,_kj::HashIndex<kj::_::(anonymous_namespace)::StringHasher>_> *)local_98;
  local_60.maybeFunc.ptr.field_1.value.indexObj =
       (HashIndex<kj::_::(anonymous_namespace)::StringHasher> *)&local_70;
  local_60.maybeFunc.ptr._0_8_ = &PTR_search_002370d8;
  local_98._8_8_ = pos;
  local_60.maybeFunc.ptr.field_1.value.success = (bool *)(table + 1);
  _::BTreeImpl::insert
            ((Iterator *)((long)local_98 + 0x10),(BTreeImpl *)&table[1].rows.builder.pos,
             (SearchKey *)&local_60);
  uVar5 = (ulong)local_88.row;
  if ((uVar5 == 0xe) || (MVar1.i = (local_88.leaf)->rows[uVar5].i, MVar1.i == 0)) {
LAB_00173f4e:
    pvVar3 = memmove((local_88.leaf)->rows + uVar5 + 1,(local_88.leaf)->rows + uVar5,
                     (ulong)(local_88.row + 1) * -4 + 0x38);
    (local_88.leaf)->rows[uVar5].i = (int)pos + 1;
    bVar2 = false;
    aVar4 = extraout_RDX;
  }
  else {
    pvVar3 = (void *)(ulong)(MVar1.i - 1);
    aVar4.value = local_70[(long)pvVar3].content.size_ - 1;
    bVar2 = true;
    if (aVar4.value != local_98._0_8_) goto LAB_00173f4e;
  }
  pos = (size_t)aVar4;
  if (bVar2) {
    *this = (Impl<1UL,_false>)0x1;
    *(void **)(this + 8) = pvVar3;
  }
  else {
    local_60.maybeFunc.ptr.isSet = true;
    local_60.maybeFunc.ptr.field_1.value.success = (bool *)((long)local_98 + 0x10);
    local_60.maybeFunc.ptr.field_1.value.pos = (size_t *)(local_98 + 8);
    *this = (Impl<1UL,_false>)0x0;
    local_88.tree._0_1_ = true;
    local_60.maybeFunc.ptr.field_1.value.indexObj =
         (HashIndex<kj::_::(anonymous_namespace)::StringHasher> *)(table + 1);
    local_60.maybeFunc.ptr.field_1.value.table = table;
    local_60.maybeFunc.ptr.field_1.value.row = row;
    _::
    Deferred<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/table.h:450:5)>
    ::~Deferred(&local_60);
    pos = (size_t)extraout_RDX_00;
  }
LAB_00173fd2:
  MVar6.ptr.field_1.value = pos;
  MVar6.ptr._0_8_ = this;
  return (Maybe<unsigned_long>)MVar6.ptr;
}

Assistant:

static kj::Maybe<size_t> insert(Table<Row, Indexes...>& table, size_t pos, Row& row, uint skip) {
    if (skip == index) {
      return Impl<index + 1>::insert(table, pos, row, skip);
    }
    auto& indexObj = get<index>(table.indexes);
    KJ_IF_SOME(existing, indexObj.insert(table.rows.asPtr(), pos, indexObj.keyForRow(row))) {
      return existing;
    }

    bool success = false;
    KJ_DEFER(if (!success) {
      indexObj.erase(table.rows.asPtr(), pos, indexObj.keyForRow(row));
    });
    auto result = Impl<index + 1>::insert(table, pos, row, skip);
    success = result == kj::none;
    return result;
  }